

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,
                mrg_parameter<int,_2,_trng::yarn2> *P)

{
  undefined4 uVar1;
  char local_1b [3];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_1b[0] = '(';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_1b,1);
  std::ostream::operator<<(out,P->a[0]);
  local_1b[2] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_1b + 2,1);
  std::ostream::operator<<(out,P->a[1]);
  local_1b[1] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_1b + 1,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const mrg_parameter &P) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '(';
      for (int i{0}; i < n; ++i) {
        out << P.a[i];
        if (i + 1 < n)
          out << ' ';
      }
      out << ')';
      out.flags(flags);
      return out;
    }